

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O3

void __thiscall
ExecutorRegVm::ExecCheckedReturn(ExecutorRegVm *this,uint typeId,RegVmRegister *regFilePtr)

{
  int iVar1;
  anon_union_8_3_3250f155_for_RegVmRegister_0 *paVar2;
  anon_union_8_3_3250f155_for_RegVmRegister_0 __src;
  ExternTypeInfo *pEVar3;
  anon_union_8_3_3250f155_for_RegVmRegister_0 __dest;
  uint uVar4;
  
  if (typeId < (this->exLinker->exTypes).count) {
    paVar2 = (anon_union_8_3_3250f155_for_RegVmRegister_0 *)this->tempStackArrayBase;
    __src = *(anon_union_8_3_3250f155_for_RegVmRegister_0 *)&paVar2->intValue;
    if (((ulong)__src < (ulong)regFilePtr[1].field_0) ||
       ((ulong)(this->dataStack).count + (regFilePtr->field_0).longValue < (ulong)__src)) {
      return;
    }
    pEVar3 = (this->exLinker->exTypes).data;
    NULLC::SetCollectMemory(false);
    if (pEVar3[typeId].field_8.arrSize != 0xffffffff) {
      uVar4 = pEVar3[typeId].size;
      __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0)NULLC::AllocObject(uVar4,typeId);
LAB_00245724:
      memcpy((void *)__dest,(void *)__src,(ulong)uVar4);
      *paVar2 = __dest;
      NULLC::SetCollectMemory(true);
      return;
    }
    uVar4 = pEVar3[typeId].field_11.subType;
    if (uVar4 < (this->exLinker->exTypes).count) {
      iVar1 = paVar2[1].intValue;
      __dest = (anon_union_8_3_3250f155_for_RegVmRegister_0)
               NULLC::AllocObject((this->exLinker->exTypes).data[uVar4].size * iVar1,uVar4);
      if (pEVar3[typeId].field_11.subType < (this->exLinker->exTypes).count) {
        uVar4 = iVar1 * (this->exLinker->exTypes).data[pEVar3[typeId].field_11.subType].size;
        goto LAB_00245724;
      }
    }
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x7f,
                "T &FastVector<ExternTypeInfo>::operator[](unsigned int) [T = ExternTypeInfo, zeroNewMemory = false, skipConstructor = false]"
               );
}

Assistant:

void ExecutorRegVm::ExecCheckedReturn(unsigned typeId, RegVmRegister * const regFilePtr)
{
	uintptr_t frameBase = regFilePtr[rvrrFrame].ptrValue;
	uintptr_t frameEnd = regFilePtr[rvrrGlobals].ptrValue + dataStack.size();

	ExternTypeInfo &type = exLinker->exTypes[typeId];

	char *returnValuePtr = (char*)tempStackArrayBase;

	void *ptr = vmLoadPointer(returnValuePtr);

	if(uintptr_t(ptr) >= frameBase && uintptr_t(ptr) <= frameEnd)
	{
		// Don't want to trigger GC at this point
		NULLC::SetCollectMemory(false);

		if(type.arrSize == ~0u)
		{
			unsigned length = *(int*)(returnValuePtr + sizeof(void*));

			char *copy = (char*)NULLC::AllocObject(exLinker->exTypes[type.subType].size * length, type.subType);
			memcpy(copy, ptr, unsigned(exLinker->exTypes[type.subType].size * length));
			vmStorePointer(returnValuePtr, copy);
		}
		else
		{
			unsigned objSize = type.size;

			char *copy = (char*)NULLC::AllocObject(objSize, typeId);
			memcpy(copy, ptr, objSize);
			vmStorePointer(returnValuePtr, copy);
		}

		NULLC::SetCollectMemory(true);
	}
}